

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

bool __thiscall
google::
sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::test_deleted(sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
               *this,size_type bucknum)

{
  const_reference ppVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (this->num_deleted != 0) {
    uVar3 = bucknum / 3 & 0xfffffffffffffff0;
    uVar2 = (int)bucknum + (int)uVar3 * -3;
    if ((((this->table).groups.
          super__Vector_base<google::sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->bitmap[(uVar2 >> 3) + uVar3] >> (uVar2 & 7) &
        1) == 0) {
      bVar4 = false;
    }
    else {
      ppVar1 = sparsetable<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
               ::unsafe_get(&this->table,bucknum);
      bVar4 = (this->key_info).delkey._i == (ppVar1->first)._i;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool test_deleted(size_type bucknum) const {
    // Invariant: !use_deleted() implies num_deleted is 0.
    assert(settings.use_deleted() || num_deleted == 0);
    return num_deleted > 0 && table.test(bucknum) &&
           test_deleted_key(get_key(table.unsafe_get(bucknum)));
  }